

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::mouseReleaseEvent(QAbstractButton *this,QMouseEvent *e)

{
  MouseButton MVar1;
  QAbstractButtonPrivate *pQVar2;
  ulong uVar3;
  undefined8 in_RCX;
  socklen_t *__addr_len;
  sockaddr *__addr;
  int __fd;
  QPointF *in_RSI;
  QAbstractButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractButtonPrivate *d;
  undefined1 down;
  QAbstractButtonPrivate *this_00;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = d_func((QAbstractButton *)0x50086f);
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
  if (MVar1 == LeftButton) {
    __addr_len = (socklen_t *)
                 (CONCAT71((int7)((ulong)in_RCX >> 8),pQVar2->field_0x28c) & 0xffffffffffffffbf);
    pQVar2->field_0x28c = (char)__addr_len;
    if (((byte)pQVar2->field_0x28c >> 4 & 1) == 0) {
      QAbstractButtonPrivate::refresh(in_RDI);
      QEvent::ignore((QEvent *)in_RSI);
    }
    else {
      QSinglePointEvent::position((QSinglePointEvent *)0x5008e1);
      down = (undefined1)((ulong)pQVar2 >> 0x38);
      local_10 = QPointF::toPoint(in_RSI);
      __fd = (int)&local_10;
      uVar3 = (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x1a0))();
      if ((uVar3 & 1) == 0) {
        setDown((QAbstractButton *)in_RSI,(bool)down);
        QEvent::ignore((QEvent *)in_RSI);
      }
      else {
        QBasicTimer::stop();
        QAbstractButtonPrivate::click(this_00);
        QEvent::accept((QEvent *)in_RSI,__fd,__addr,__addr_len);
      }
    }
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QAbstractButton);

    if (e->button() != Qt::LeftButton) {
        e->ignore();
        return;
    }

    d->pressed = false;

    if (!d->down) {
        // refresh is required by QMacStyle to resume the default button animation
        d->refresh();
        e->ignore();
        return;
    }

    if (hitButton(e->position().toPoint())) {
        d->repeatTimer.stop();
        d->click();
        e->accept();
    } else {
        setDown(false);
        e->ignore();
    }
}